

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void libxml_xmlErrorFuncHandler(void *ctx,char *msg,...)

{
  char in_AL;
  int iVar1;
  PyObject *op;
  PyObject *pPVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char local_438 [8];
  char str [1000];
  PyObject *result;
  PyObject *message;
  PyObject *list;
  va_list ap;
  char *msg_local;
  void *ctx_local;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  if (libxml_xmlPythonErrorFuncHandler == (PyObject *)0x0) {
    ap[0].overflow_arg_area = local_4e8;
    ap[0]._0_8_ = &stack0x00000008;
    list._4_4_ = 0x30;
    list._0_4_ = 0x10;
    vfprintf(_stderr,msg,&list);
  }
  else {
    ap[0].overflow_arg_area = local_4e8;
    ap[0]._0_8_ = &stack0x00000008;
    list._4_4_ = 0x30;
    list._0_4_ = 0x10;
    iVar1 = vsnprintf(local_438,999,msg,&list);
    if (0x3e5 < iVar1) {
      str[0x3df] = '\0';
    }
    op = (PyObject *)PyTuple_New(2);
    PyTuple_SetItem(op,0,libxml_xmlPythonErrorFuncCtxt);
    _Py_XINCREF(libxml_xmlPythonErrorFuncCtxt);
    pPVar2 = libxml_charPtrConstWrap(local_438);
    PyTuple_SetItem(op,1,pPVar2);
    str._992_8_ = PyEval_CallObjectWithKeywords(libxml_xmlPythonErrorFuncHandler,op,0);
    _Py_XDECREF(op);
    _Py_XDECREF((PyObject *)str._992_8_);
  }
  return;
}

Assistant:

static void
libxml_xmlErrorFuncHandler(ATTRIBUTE_UNUSED void *ctx, const char *msg,
                           ...)
{
    va_list ap;
    PyObject *list;
    PyObject *message;
    PyObject *result;
    char str[1000];

#ifdef DEBUG_ERROR
    printf("libxml_xmlErrorFuncHandler(%p, %s, ...) called\n", ctx, msg);
#endif


    if (libxml_xmlPythonErrorFuncHandler == NULL) {
        va_start(ap, msg);
        vfprintf(stderr, msg, ap);
        va_end(ap);
    } else {
        va_start(ap, msg);
        if (vsnprintf(str, 999, msg, ap) >= 998)
	    str[999] = 0;
        va_end(ap);

        list = PyTuple_New(2);
        PyTuple_SetItem(list, 0, libxml_xmlPythonErrorFuncCtxt);
        Py_XINCREF(libxml_xmlPythonErrorFuncCtxt);
        message = libxml_charPtrConstWrap(str);
        PyTuple_SetItem(list, 1, message);
        result = PyEval_CallObject(libxml_xmlPythonErrorFuncHandler, list);
        Py_XDECREF(list);
        Py_XDECREF(result);
    }
}